

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

uint8_t * __thiscall
MPEGSequenceHeader::deserializeExtension(MPEGSequenceHeader *this,BitStreamReader *bitReader)

{
  undefined1 *puVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  
  BitStreamReader::skipBit(bitReader);
  uVar5 = BitStreamReader::getBits(bitReader,3);
  this->profile = (int8_t)uVar5;
  uVar5 = BitStreamReader::getBits(bitReader,4);
  this->level = (int8_t)uVar5;
  bVar4 = BitStreamReader::getBit(bitReader);
  this->progressive_sequence = bVar4;
  uVar5 = BitStreamReader::getBits(bitReader,2);
  this->chroma_format = (uint8_t)uVar5;
  uVar5 = BitStreamReader::getBits(bitReader,2);
  this->horiz_size_ext = (uint8_t)uVar5;
  uVar5 = BitStreamReader::getBits(bitReader,2);
  this->vert_size_ext = (uint8_t)uVar5;
  iVar2._0_1_ = this->horiz_size_ext;
  iVar2._1_1_ = this->vert_size_ext;
  iVar2._2_2_ = this->bit_rate_ext;
  puVar1 = &(this->super_MPEGRawDataHeader).field_0x1c;
  *(ushort *)puVar1 = *(ushort *)puVar1 | (ushort)(iVar2 << 0xc);
  puVar1 = &(this->super_MPEGRawDataHeader).field_0x1e;
  *(ushort *)puVar1 = *(ushort *)puVar1 | (ushort)(uVar5 << 0xc);
  uVar5 = BitStreamReader::getBits(bitReader,0xc);
  this->bit_rate_ext = (uint16_t)uVar5;
  this->bit_rate = this->bit_rate + uVar5 * 0x6400000;
  BitStreamReader::skipBit(bitReader);
  uVar5 = BitStreamReader::getBits(bitReader,8);
  this->rc_buffer_size = this->rc_buffer_size + uVar5 * 0x1000000;
  bVar4 = BitStreamReader::getBit(bitReader);
  this->low_delay = bVar4;
  uVar5 = BitStreamReader::getBits(bitReader,2);
  (this->frame_rate_ext).num = (uVar5 & 0xff) + 1;
  uVar5 = BitStreamReader::getBits(bitReader,5);
  (this->frame_rate_ext).den = (uVar5 & 0xff) + 1;
  puVar3 = (bitReader->super_BitStream).m_initBuffer;
  return (uint8_t *)
         ((long)((int)(((*(int *)&(bitReader->super_BitStream).m_buffer - (int)puVar3) * 8 -
                        bitReader->m_bitLeft | 7) + 0x21) >> 3) + (long)puVar3);
}

Assistant:

uint8_t* MPEGSequenceHeader::deserializeExtension(BitStreamReader& bitReader)
{
    bitReader.skipBit(); /* profile and level esc*/
    profile = bitReader.getBits<int8_t>(3);
    level = bitReader.getBits<int8_t>(4);

    progressive_sequence = bitReader.getBit();     /* progressive_sequence */
    chroma_format = bitReader.getBits<uint8_t>(2); /* chroma_format 1=420, 2=422, 3=444 */

    horiz_size_ext = bitReader.getBits<uint8_t>(2);
    vert_size_ext = bitReader.getBits<uint8_t>(2);
    width |= horiz_size_ext << 12;
    height |= vert_size_ext << 12;

    bit_rate_ext = bitReader.getBits<int16_t>(12); /* XXX: handle it */
    bit_rate += (bit_rate_ext << 18) * 400;

    bitReader.skipBit();  // marker

    rc_buffer_size += bitReader.getBits(8) * 1024 * 16 << 10;

    low_delay = bitReader.getBit();  // disable b-frame if true
    frame_rate_ext.num = bitReader.getBits<uint8_t>(2) + 1;
    frame_rate_ext.den = bitReader.getBits<uint8_t>(5) + 1;

    // return bitContext.buffer_ptr;
    return skipProcessedBytes(bitReader);
}